

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O1

void __thiscall QTextMarkdownImporter::import(QTextMarkdownImporter *this,QString *markdown)

{
  char16_t **ppcVar1;
  char16_t *pcVar2;
  int *piVar3;
  totally_ordered_wrapper<QFontPrivate_*> tVar4;
  char cVar5;
  int iVar6;
  QTextDocument *this_00;
  long lVar7;
  storage_type_conflict *psVar8;
  long lVar9;
  QChar *pQVar10;
  MD_CHAR *text;
  storage_type_conflict *psVar11;
  char *pcVar12;
  long lVar13;
  long in_FS_OFFSET;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QByteArrayView QVar19;
  QStringView QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  MD_PARSER callbacks;
  QString local_f8;
  char *local_e0;
  totally_ordered_wrapper<QFontPrivate_*> local_d0;
  undefined1 local_c8 [8];
  totally_ordered_wrapper<QFontPrivate_*> local_c0;
  QFont local_b8;
  MD_PARSER local_a8;
  QString local_60;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8._0_8_ =
       (ulong)(this->m_features).super_QFlagsStorageHelper<QTextMarkdownImporter::Feature,_4>.
              super_QFlagsStorage<QTextMarkdownImporter::Feature>.i << 0x20;
  local_a8.enter_block = CbEnterBlock;
  local_a8.leave_block = CbLeaveBlock;
  local_a8.enter_span = CbEnterSpan;
  local_a8.leave_span = CbLeaveSpan;
  local_a8.text = CbText;
  local_a8.debug_log = CbDebugLog;
  local_a8.syntax = (_func_void *)0x0;
  this_00 = QTextCursor::document(&this->m_cursor);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::defaultFont((QTextDocument *)local_48);
  iVar6 = QFont::pointSize((QFont *)local_48);
  this->m_paragraphMargin = (iVar6 * 2) / 3;
  (**(code **)(*(long *)this_00 + 0x60))(this_00);
  iVar6 = QFont::pointSize((QFont *)local_48);
  if (iVar6 == -1) {
    iVar6 = QFont::pixelSize((QFont *)local_48);
    QFont::setPixelSize(&this->m_monoFont,iVar6);
  }
  else {
    iVar6 = QFont::pointSize((QFont *)local_48);
    QFont::setPointSize(&this->m_monoFont,iVar6);
  }
  lcMD();
  if (((byte)lcMD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_f8.d.d._0_4_ = 2;
    local_f8.d.d._4_4_ = 0;
    local_f8.d.ptr._0_4_ = 0;
    local_f8.d.ptr._4_4_ = 0;
    local_f8.d.size._0_4_ = 0;
    local_f8.d.size._4_4_ = 0;
    local_e0 = lcMD::category.name;
    QMessageLogger::debug();
    tVar4.ptr = local_d0.ptr;
    QVar14.m_data = (storage_type *)0xc;
    QVar14.m_size = (qsizetype)&local_60;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<((QTextStream *)tVar4.ptr,&local_60);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)((local_d0.ptr)->request).styleName.d.size == '\x01') {
      QTextStream::operator<<((QTextStream *)local_d0.ptr,' ');
    }
    local_c8 = (undefined1  [8])local_d0.ptr;
    ppcVar1 = &((local_d0.ptr)->request).styleName.d.ptr;
    *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
    ::operator<<((Stream *)&local_c0,(QFont *)local_c8);
    tVar4.ptr = local_c0.ptr;
    QVar15.m_data = (storage_type *)0x9;
    QVar15.m_size = (qsizetype)&local_60;
    QString::fromUtf8(QVar15);
    QTextStream::operator<<((QTextStream *)tVar4.ptr,&local_60);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)((local_c0.ptr)->request).styleName.d.size == '\x01') {
      QTextStream::operator<<((QTextStream *)local_c0.ptr,' ');
    }
    local_b8.d.d.ptr =
         (totally_ordered_wrapper<QFontPrivate_*>)
         (totally_ordered_wrapper<QFontPrivate_*>)local_c0.ptr;
    ppcVar1 = &((local_c0.ptr)->request).styleName.d.ptr;
    *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
    ::operator<<((QDebug)&local_b8.resolve_mask,&local_b8);
    QDebug::~QDebug((QDebug *)&local_b8.resolve_mask);
    QDebug::~QDebug((QDebug *)&local_b8);
    QDebug::~QDebug((QDebug *)&local_c0);
    QDebug::~QDebug((QDebug *)local_c8);
    QDebug::~QDebug((QDebug *)&local_d0);
  }
  pcVar2 = (markdown->d).ptr;
  psVar11 = (storage_type_conflict *)(markdown->d).size;
  if (((this->m_features).super_QFlagsStorageHelper<QTextMarkdownImporter::Feature,_4>.
       super_QFlagsStorage<QTextMarkdownImporter::Feature>.i & 0x100000) == 0) goto LAB_005ce03c;
  pcVar12 = "---\n";
  lVar9 = 4;
  QVar16.m_data = pcVar2;
  QVar16.m_size = (qsizetype)psVar11;
  QVar21.m_data = "---\n";
  QVar21.m_size = 4;
  cVar5 = QtPrivate::startsWith(QVar16,QVar21,CaseSensitive);
  psVar8 = psVar11;
  if (cVar5 == '\0') {
    pcVar12 = "---\r\n";
    lVar9 = 5;
    QVar17.m_data = pcVar2;
    QVar17.m_size = (qsizetype)psVar11;
    QVar22.m_data = "---\r\n";
    QVar22.m_size = 5;
    cVar5 = QtPrivate::startsWith(QVar17,QVar22,CaseSensitive);
    pQVar10 = (QChar *)0x0;
    lVar13 = 0;
    if (cVar5 != '\0') goto LAB_005cdeaa;
  }
  else {
LAB_005cdeaa:
    QVar18.m_data = pcVar2;
    QVar18.m_size = (qsizetype)psVar11;
    QVar23.m_data = pcVar12;
    QVar23.m_size = lVar9;
    lVar7 = QtPrivate::findString(QVar18,lVar9,QVar23,CaseSensitive);
    pQVar10 = (QChar *)0x0;
    if (lVar7 < 0) {
      lVar13 = 0;
    }
    else {
      lVar13 = 0;
      if (pcVar2[lVar7 + -1] == L'\n') {
        lVar13 = lVar7 - lVar9;
        pQVar10 = (QChar *)(pcVar2 + lVar9);
        psVar8 = (storage_type_conflict *)((long)psVar11 - (lVar7 + lVar9));
      }
    }
  }
  if (lVar13 != 0) {
    QString::QString(&local_f8,pQVar10,lVar13);
    QTextDocument::setMetaInformation(this_00,FrontMatter,&local_f8);
    piVar3 = (int *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_),2,0x10)
        ;
      }
    }
    lcMD();
    psVar11 = psVar8;
    if (((byte)lcMD::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_f8.d.d._0_4_ = 2;
      local_f8.d.d._4_4_ = 0;
      local_f8.d.ptr._0_4_ = 0;
      local_f8.d.ptr._4_4_ = 0;
      local_f8.d.size._0_4_ = 0;
      local_f8.d.size._4_4_ = 0;
      local_e0 = lcMD::category.name;
      QMessageLogger::debug();
      tVar4.ptr = local_c0.ptr;
      QVar19.m_data = (storage_type *)0x1b;
      QVar19.m_size = (qsizetype)&local_60;
      QString::fromUtf8(QVar19);
      QTextStream::operator<<((QTextStream *)tVar4.ptr,&local_60);
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)((local_c0.ptr)->request).styleName.d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)local_c0.ptr,' ');
      }
      QTextStream::operator<<((QTextStream *)local_c0.ptr,lVar13);
      if ((char)((local_c0.ptr)->request).styleName.d.size == '\x01') {
        QTextStream::operator<<((QTextStream *)local_c0.ptr,' ');
      }
      QDebug::~QDebug((QDebug *)&local_c0);
    }
  }
LAB_005ce03c:
  local_f8.d.size._0_4_ = 0xaaaaaaaa;
  local_f8.d.size._4_4_ = 0xaaaaaaaa;
  local_f8.d.d._0_4_ = 0xaaaaaaaa;
  local_f8.d.d._4_4_ = 0xaaaaaaaa;
  local_f8.d.ptr._0_4_ = 0xaaaaaaaa;
  local_f8.d.ptr._4_4_ = 0xaaaaaaaa;
  QVar20.m_data = psVar11;
  QVar20.m_size = (qsizetype)&local_f8;
  QtPrivate::convertToUtf8(QVar20);
  QTextCursor::beginEditBlock(&this->m_cursor);
  text = (MD_CHAR *)CONCAT44(local_f8.d.ptr._4_4_,local_f8.d.ptr._0_4_);
  if (text == (MD_CHAR *)0x0) {
    text = (MD_CHAR *)&QByteArray::_empty;
  }
  md_parse(text,(MD_SIZE)local_f8.d.size,&local_a8,this);
  QTextCursor::endEditBlock(&this->m_cursor);
  piVar3 = (int *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_),1,0x10);
    }
  }
  QFont::~QFont((QFont *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextMarkdownImporter::import(const QString &markdown)
{
    MD_PARSER callbacks = {
        0, // abi_version
        unsigned(m_features),
        &CbEnterBlock,
        &CbLeaveBlock,
        &CbEnterSpan,
        &CbLeaveSpan,
        &CbText,
        &CbDebugLog,
        nullptr // syntax
    };
    QTextDocument *doc = m_cursor.document();
    const auto defaultFont = doc->defaultFont();
    m_paragraphMargin = defaultFont.pointSize() * 2 / 3;
    doc->clear();
    if (defaultFont.pointSize() != -1)
        m_monoFont.setPointSize(defaultFont.pointSize());
    else
        m_monoFont.setPixelSize(defaultFont.pixelSize());
    qCDebug(lcMD) << "default font" << defaultFont << "mono font" << m_monoFont;
    QStringView md = markdown;

    if (m_features.testFlag(QTextMarkdownImporter::FeatureFrontMatter)) {
        if (const auto split = splitFrontMatter(md)) {
            doc->setMetaInformation(QTextDocument::FrontMatter, split.frontMatter.toString());
            qCDebug(lcMD) << "extracted FrontMatter: size" << split.frontMatter.size();
            md = split.rest;
        }
    }

    const auto mdUtf8 = md.toUtf8();
    m_cursor.beginEditBlock();
    md_parse(mdUtf8.constData(), MD_SIZE(mdUtf8.size()), &callbacks, this);
    m_cursor.endEditBlock();
}